

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase28::run(TestCase28 *this)

{
  undefined4 local_14;
  Function<int_(int,_int)> f;
  
  f.impl.ptr = (Iface *)operator_new(0x10);
  (f.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00421650;
  f.impl.ptr[1]._vptr_Iface = (_func_int **)&local_14;
  f.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(int,int)>::Impl<kj::(anonymous_namespace)::TestCase28::run()::$_0>>
        ::instance;
  local_14 = 3;
  Own<kj::Function<int_(int,_int)>::Iface>::dispose(&f.impl);
  return;
}

Assistant:

TEST(Function, Lambda) {
  int i = 0;

  Function<int(int, int)> f = [&](int a, int b) { return a + b + i++; };

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9 + 2 + 2, f(2, 9));

  EXPECT_EQ(i, 3);
}